

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O0

int cubic_on_switch(quicly_cc_t *cc)

{
  quicly_cc_t *in_RDI;
  uint32_t in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_RDI->type == &quicly_cc_type_cubic) {
    local_4 = 1;
  }
  else if ((in_RDI->type == &quicly_cc_type_reno) || (in_RDI->type == &quicly_cc_type_pico)) {
    if (in_RDI->cwnd_exiting_slow_start == 0) {
      in_RDI->type = &quicly_cc_type_cubic;
    }
    else {
      cubic_reset(in_RDI,in_stack_ffffffffffffffec);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cubic_on_switch(quicly_cc_t *cc)
{
    if (cc->type == &quicly_cc_type_cubic)
        return 1;

    if (cc->type == &quicly_cc_type_reno || cc->type == &quicly_cc_type_pico) {
        /* When in slow start, state can be reused as-is; otherwise, restart. */
        if (cc->cwnd_exiting_slow_start == 0) {
            cc->type = &quicly_cc_type_cubic;
        } else {
            cubic_reset(cc, cc->cwnd_initial);
        }
        return 1;
    }

    return 0;
}